

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O3

ImagePyramid * aom_alloc_pyramid(int width,int height,_Bool image_is_16bit)

{
  pthread_mutex_t *__mutex;
  void *pvVar1;
  pthread_mutex_t *memblk;
  uint *puVar2;
  uint uVar3;
  ulong uVar4;
  long *plVar5;
  uint uVar6;
  ulong uVar7;
  size_t size;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong num;
  
  uVar11 = height;
  if (width < height) {
    uVar11 = width;
  }
  uVar3 = 0x1f;
  if (uVar11 != 0) {
    for (; uVar11 >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  uVar11 = 4;
  if (4 < uVar3) {
    uVar11 = uVar3;
  }
  __mutex = (pthread_mutex_t *)aom_calloc(1,0x40);
  if (__mutex == (pthread_mutex_t *)0x0) {
    return (ImagePyramid *)0x0;
  }
  uVar11 = uVar11 - 3;
  num = (ulong)uVar11;
  pvVar1 = aom_calloc(num,0x18);
  *(void **)((long)__mutex + 0x38) = pvVar1;
  memblk = __mutex;
  if (pvVar1 != (void *)0x0) {
    __mutex[1].__data.__lock = uVar11;
    *(undefined4 *)((long)__mutex + 0x2c) = 0;
    memblk = (pthread_mutex_t *)aom_calloc(num,8);
    if (memblk != (pthread_mutex_t *)0x0) {
      if (!image_is_16bit < uVar11) {
        uVar3 = (uint)!image_is_16bit;
        uVar7 = (ulong)uVar3;
        puVar2 = (uint *)(*(long *)((long)__mutex + 0x38) + uVar7 * 0x18 + 0x10);
        size = 0x10;
        uVar4 = uVar7;
        do {
          uVar6 = width >> ((byte)uVar4 & 0x1f);
          uVar8 = height >> ((byte)uVar4 & 0x1f);
          uVar9 = uVar6 + 0x3f & 0xffffffe0;
          lVar10 = (long)(int)(uVar9 << 4) + size;
          size = (long)(int)((uVar8 + 0x20) * uVar9) + size;
          *(long *)((long)memblk + uVar4 * 8) = lVar10 + 0x10;
          puVar2[-2] = uVar6;
          puVar2[-1] = uVar8;
          *puVar2 = uVar9;
          uVar4 = uVar4 + 1;
          puVar2 = puVar2 + 6;
        } while (num != uVar4);
        pvVar1 = aom_memalign(0x20,size);
        *(void **)((long)__mutex + 0x30) = pvVar1;
        if (pvVar1 == (void *)0x0) goto LAB_0029df33;
        if (uVar3 < uVar11) {
          plVar5 = (long *)((ulong)(uVar3 * 0x18) + *(long *)((long)__mutex + 0x38));
          do {
            *plVar5 = *(long *)((long)memblk + uVar7 * 8) + (long)pvVar1;
            uVar7 = uVar7 + 1;
            plVar5 = plVar5 + 3;
          } while (num != uVar7);
        }
      }
      else {
        pvVar1 = aom_memalign(0x20,0x10);
        *(void **)((long)__mutex + 0x30) = pvVar1;
        if (pvVar1 == (void *)0x0) {
LAB_0029df33:
          aom_free(*(void **)((long)__mutex + 0x38));
          aom_free(__mutex);
          goto LAB_0029deee;
        }
      }
      pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
      goto LAB_0029df19;
    }
    aom_free(*(void **)((long)__mutex + 0x38));
    memblk = __mutex;
  }
LAB_0029deee:
  __mutex = (pthread_mutex_t *)0x0;
LAB_0029df19:
  aom_free(memblk);
  return (ImagePyramid *)__mutex;
}

Assistant:

ImagePyramid *aom_alloc_pyramid(int width, int height, bool image_is_16bit) {
  // Allocate the maximum possible number of layers for this width and height
  const int msb = get_msb(AOMMIN(width, height));
  const int n_levels = AOMMAX(msb - MIN_PYRAMID_SIZE_LOG2, 1);

  ImagePyramid *pyr = aom_calloc(1, sizeof(*pyr));
  if (!pyr) {
    return NULL;
  }

  pyr->layers = aom_calloc(n_levels, sizeof(*pyr->layers));
  if (!pyr->layers) {
    aom_free(pyr);
    return NULL;
  }

  pyr->max_levels = n_levels;
  pyr->filled_levels = 0;

  // Compute sizes and offsets for each pyramid level
  // These are gathered up first, so that we can allocate all pyramid levels
  // in a single buffer
  size_t buffer_size = 0;
  size_t *layer_offsets = aom_calloc(n_levels, sizeof(*layer_offsets));
  if (!layer_offsets) {
    aom_free(pyr->layers);
    aom_free(pyr);
    return NULL;
  }

  // Work out if we need to allocate a few extra bytes for alignment.
  // aom_memalign() will ensure that the start of the allocation is aligned
  // to a multiple of PYRAMID_ALIGNMENT. But we want the first image pixel
  // to be aligned, not the first byte of the allocation.
  //
  // In the loop below, we ensure that the stride of every image is a multiple
  // of PYRAMID_ALIGNMENT. Thus the allocated size of each pyramid level will
  // also be a multiple of PYRAMID_ALIGNMENT. Thus, as long as we can get the
  // first pixel in the first pyramid layer aligned properly, that will
  // automatically mean that the first pixel of every row of every layer is
  // properly aligned too.
  //
  // Thus all we need to consider is the first pixel in the first layer.
  // This is located at offset
  //   extra_bytes + level_stride * PYRAMID_PADDING + PYRAMID_PADDING
  // bytes into the buffer. Since level_stride is a multiple of
  // PYRAMID_ALIGNMENT, we can ignore that. So we need
  //   extra_bytes + PYRAMID_PADDING = multiple of PYRAMID_ALIGNMENT
  //
  // To solve this, we can round PYRAMID_PADDING up to the next multiple
  // of PYRAMID_ALIGNMENT, then subtract the orginal value to calculate
  // how many extra bytes are needed.
  size_t first_px_offset =
      (PYRAMID_PADDING + PYRAMID_ALIGNMENT - 1) & ~(PYRAMID_ALIGNMENT - 1);
  size_t extra_bytes = first_px_offset - PYRAMID_PADDING;
  buffer_size += extra_bytes;

  // If the original image is stored in an 8-bit buffer, then we can point the
  // lowest pyramid level at that buffer rather than allocating a new one.
  int first_allocated_level = image_is_16bit ? 0 : 1;

  for (int level = first_allocated_level; level < n_levels; level++) {
    PyramidLayer *layer = &pyr->layers[level];

    int level_width = width >> level;
    int level_height = height >> level;

    // Allocate padding for each layer
    int padded_width = level_width + 2 * PYRAMID_PADDING;
    int padded_height = level_height + 2 * PYRAMID_PADDING;

    // Align the layer stride to be a multiple of PYRAMID_ALIGNMENT
    // This ensures that, as long as the top-left pixel in this pyramid level is
    // properly aligned, then so will the leftmost pixel in every row of the
    // pyramid level.
    int level_stride =
        (padded_width + PYRAMID_ALIGNMENT - 1) & ~(PYRAMID_ALIGNMENT - 1);

    size_t level_alloc_start = buffer_size;
    size_t level_start =
        level_alloc_start + PYRAMID_PADDING * level_stride + PYRAMID_PADDING;

    buffer_size += level_stride * padded_height;

    layer_offsets[level] = level_start;
    layer->width = level_width;
    layer->height = level_height;
    layer->stride = level_stride;
  }

  pyr->buffer_alloc =
      aom_memalign(PYRAMID_ALIGNMENT, buffer_size * sizeof(*pyr->buffer_alloc));
  if (!pyr->buffer_alloc) {
    aom_free(pyr->layers);
    aom_free(pyr);
    aom_free(layer_offsets);
    return NULL;
  }

  // Fill in pointers for each level
  // If image is 8-bit, then the lowest level is left unconfigured for now,
  // and will be set up properly when the pyramid is filled in
  for (int level = first_allocated_level; level < n_levels; level++) {
    PyramidLayer *layer = &pyr->layers[level];
    layer->buffer = pyr->buffer_alloc + layer_offsets[level];
  }

#if CONFIG_MULTITHREAD
  pthread_mutex_init(&pyr->mutex, NULL);
#endif  // CONFIG_MULTITHREAD

  aom_free(layer_offsets);
  return pyr;
}